

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O2

float memory_tree_ns::F1_score_for_two_examples(example *ec1,example *ec2)

{
  undefined1 auVar1 [12];
  float fVar2;
  undefined1 auVar3 [16];
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  ulong uVar8;
  
  fVar2 = get_overlap_from_two_examples(ec1,ec2);
  fVar4 = 0.0;
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    uVar7 = (long)(ec2->l).cs.costs._end - (long)(ec2->l).cs.costs._begin;
    uVar8 = (long)(ec1->l).cs.costs._end - (long)(ec1->l).cs.costs._begin;
    auVar1._4_8_ = uVar8;
    auVar1._0_4_ = (int)((long)uVar7 >> 0x22);
    auVar5._0_8_ = auVar1._0_8_ << 0x20;
    auVar5._8_4_ = (int)uVar8 >> 2;
    auVar5._12_4_ = (int)((long)uVar8 >> 0x22);
    auVar3._0_8_ = (double)fVar2;
    auVar6._0_8_ = ((double)(auVar1._0_8_ & 0xffffffff | 0x4530000000000000) -
                   1.9342813118337666e+25) + (double)(uVar7 >> 2 & 0xffffffff | 0x4330000000000000)
                   + 1e-07;
    auVar6._8_8_ = ((double)(auVar5._8_8_ >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                   (double)(uVar8 >> 2 & 0xffffffff | 0x4330000000000000) + 1e-07;
    auVar3._8_8_ = auVar3._0_8_;
    auVar3 = divpd(auVar3,auVar6);
    fVar4 = ((float)auVar3._0_8_ * (float)auVar3._8_8_) /
            ((float)auVar3._8_8_ + (float)auVar3._0_8_);
    fVar4 = fVar4 + fVar4;
  }
  return fVar4;
}

Assistant:

float F1_score_for_two_examples(example& ec1, example& ec2){
        float num_overlaps = get_overlap_from_two_examples(ec1, ec2);
	    float v1 = num_overlaps/(1e-7+ec1.l.multilabels.label_v.size()*1.);
        float v2 = num_overlaps/(1e-7+ec2.l.multilabels.label_v.size()*1.);
        if (num_overlaps == 0.f)
            return 0.f;
        else
	    //return v2; //only precision
            return 2.*(v1*v2/(v1+v2));
    }